

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::polygon_layer_to_gds(three_dim_model *this,int *layer_number)

{
  uint uVar1;
  pointer pcVar2;
  uint __val;
  uint uVar3;
  mapped_type *pmVar4;
  long *plVar5;
  uint uVar6;
  pointer *__n;
  ulong uVar7;
  pointer corX;
  uint __len;
  string __str;
  gdsSTR main;
  gdscpp my_polygons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [16];
  pointer local_338;
  pointer piStack_330;
  gdsSTR local_2e0;
  gdscpp local_1e8;
  gdsSTR local_128;
  
  gdscpp::gdscpp(&local_1e8);
  local_2e0.name._M_dataplus._M_p = (pointer)&local_2e0.name.field_2;
  local_2e0.name._M_string_length = 0;
  local_2e0.name.field_2._M_local_buf[0] = '\0';
  local_2e0.heirarchical_level = 0;
  local_2e0.bounding_box[0] = 0;
  local_2e0.bounding_box[1] = 0;
  local_2e0.bounding_box[2] = 0;
  local_2e0.bounding_box[3] = 0;
  memset(&local_2e0.last_modified,0,0xc0);
  uVar1 = *layer_number;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00155cb5;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00155cb5;
      }
      if (uVar6 < 10000) goto LAB_00155cb5;
      uVar7 = uVar7 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00155cb5:
  local_348._0_8_ = &local_338;
  std::__cxx11::string::_M_construct((ulong)local_348,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + local_348._0_8_),__len,__val);
  std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_348);
  if ((pointer *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(long)local_338 + 1);
  }
  local_348._0_4_ = *layer_number;
  pmVar4 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,(key_type_conflict *)local_348);
  pcVar2 = (pmVar4->super__Vector_base<co_ord,_std::allocator<co_ord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_348._0_4_ = *layer_number;
  pmVar4 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,(key_type_conflict *)local_348);
  corX = (pmVar4->super__Vector_base<co_ord,_std::allocator<co_ord>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (corX != pcVar2) {
    do {
      drawBoundary((gdsBOUNDARY *)local_348,*layer_number,&corX->x,&corX->y);
      std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
                (&local_2e0.BOUNDARY,(gdsBOUNDARY *)local_348);
      gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_348);
      corX = corX + 1;
    } while (corX != pcVar2);
  }
  gdsSTR::gdsSTR(&local_128,&local_2e0);
  gdscpp::setSTR(&local_1e8,&local_128);
  gdsSTR::~gdsSTR(&local_128);
  std::operator+(&local_368,"data/",&local_2e0.name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
  __n = (pointer *)(plVar5 + 2);
  if ((pointer *)*plVar5 == __n) {
    local_338 = *__n;
    piStack_330 = (pointer)plVar5[3];
    local_348._0_8_ = &local_338;
  }
  else {
    local_338 = *__n;
    local_348._0_8_ = (pointer *)*plVar5;
  }
  local_348._8_8_ = plVar5[1];
  *plVar5 = (long)__n;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  gdscpp::write(&local_1e8,(int)local_348,(void *)local_348._8_8_,(size_t)__n);
  if ((pointer *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(long)local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  gdsSTR::~gdsSTR(&local_2e0);
  gdscpp::~gdscpp(&local_1e8);
  return;
}

Assistant:

void MODEL3D::three_dim_model::polygon_layer_to_gds(const int &layer_number)
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = std::to_string(layer_number);
    auto poly_end = polygons_map[layer_number].end();
    for (auto poly_it = polygons_map[layer_number].begin(); poly_it != poly_end; poly_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , poly_it->x, poly_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}